

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_avcc.cpp
# Opt level: O0

int write_avcc(avcc_t *avcc,h264_stream_t *h,bs_t *b)

{
  uint32_t uVar1;
  int iVar2;
  uint8_t *puVar3;
  int pictureParameterSetLength;
  int len_1;
  uint8_t *buf_1;
  int max_len_1;
  int i_1;
  int sequenceParameterSetLength;
  int len;
  uint8_t *buf;
  int max_len;
  int i;
  bs_t *b_local;
  h264_stream_t *h_local;
  avcc_t *avcc_local;
  
  bs_write_u8(b,1);
  bs_write_u8(b,avcc->AVCProfileIndication);
  bs_write_u8(b,avcc->profile_compatibility);
  bs_write_u8(b,avcc->AVCLevelIndication);
  bs_write_u(b,6,0x3f);
  bs_write_u(b,2,avcc->lengthSizeMinusOne);
  bs_write_u(b,3,7);
  bs_write_u(b,5,avcc->numOfSequenceParameterSets);
  for (buf._4_4_ = 0; buf._4_4_ < avcc->numOfSequenceParameterSets; buf._4_4_ = buf._4_4_ + 1) {
    puVar3 = (uint8_t *)malloc(0x400);
    h->nal->nal_ref_idc = 3;
    h->nal->nal_unit_type = 7;
    h->sps = avcc->sps_table[buf._4_4_];
    uVar1 = write_nal_unit(h,puVar3,0x400);
    if ((int)uVar1 < 0) {
      free(puVar3);
    }
    else {
      bs_write_u(b,0x10,uVar1);
      bs_write_bytes(b,puVar3,uVar1);
      free(puVar3);
    }
  }
  bs_write_u(b,8,avcc->numOfPictureParameterSets);
  for (buf_1._4_4_ = 0; buf_1._4_4_ < avcc->numOfPictureParameterSets; buf_1._4_4_ = buf_1._4_4_ + 1
      ) {
    puVar3 = (uint8_t *)malloc(0x400);
    h->nal->nal_ref_idc = 3;
    h->nal->nal_unit_type = 8;
    h->pps = avcc->pps_table[buf_1._4_4_];
    uVar1 = write_nal_unit(h,puVar3,0x400);
    if ((int)uVar1 < 0) {
      free(puVar3);
    }
    else {
      bs_write_u(b,0x10,uVar1);
      bs_write_bytes(b,puVar3,uVar1);
      free(puVar3);
    }
  }
  iVar2 = bs_overrun(b);
  if (iVar2 == 0) {
    avcc_local._4_4_ = bs_pos(b);
  }
  else {
    avcc_local._4_4_ = -1;
  }
  return avcc_local._4_4_;
}

Assistant:

int write_avcc(avcc_t* avcc, h264_stream_t* h, bs_t* b)
{
    bs_write_u8(b, 1); // configurationVersion = 1;
    bs_write_u8(b, avcc->AVCProfileIndication);
    bs_write_u8(b, avcc->profile_compatibility);
    bs_write_u8(b, avcc->AVCLevelIndication);
    bs_write_u(b, 6, 0x3F); // reserved = '111111'b;
    bs_write_u(b, 2, avcc->lengthSizeMinusOne);
    bs_write_u(b, 3, 0x07); // reserved = '111'b;

    bs_write_u(b, 5, avcc->numOfSequenceParameterSets);
    for (int i = 0; i < avcc->numOfSequenceParameterSets; i++)
    {
        int max_len = 1024; // FIXME
        uint8_t* buf = (uint8_t*)malloc(max_len);
        h->nal->nal_ref_idc = 3; // NAL_REF_IDC_PRIORITY_HIGHEST;
        h->nal->nal_unit_type = NAL_UNIT_TYPE_SPS;
        h->sps = avcc->sps_table[i];
        int len = write_nal_unit(h, buf, max_len);
        if (len < 0) { free(buf); continue; } // TODO report errors
        int sequenceParameterSetLength = len;
        bs_write_u(b, 16, sequenceParameterSetLength);
        bs_write_bytes(b, buf, len);
        free(buf);
    }

    bs_write_u(b, 8, avcc->numOfPictureParameterSets);
    for (int i = 0; i < avcc->numOfPictureParameterSets; i++)
    {
        int max_len = 1024; // FIXME
        uint8_t* buf = (uint8_t*)malloc(max_len);
        h->nal->nal_ref_idc = 3; // NAL_REF_IDC_PRIORITY_HIGHEST;
        h->nal->nal_unit_type = NAL_UNIT_TYPE_PPS;
        h->pps = avcc->pps_table[i];
        int len = write_nal_unit(h, buf, max_len);
        if (len < 0) { free(buf); continue; } // TODO report errors
        int pictureParameterSetLength = len;
        bs_write_u(b, 16, pictureParameterSetLength);
        bs_write_bytes(b, buf, len);
        free(buf);
    }

    if (bs_overrun(b)) { return -1; }
    return bs_pos(b);
}